

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

int Gli_ManCreateNode(Gli_Man_t *p,Vec_Int_t *vFanins,int nFanouts,word *pGateTruth)

{
  int iVar1;
  uint uVar2;
  Gli_Obj_t *pObj_00;
  bool bVar3;
  int local_3c;
  Gli_Obj_t *pGStack_38;
  int i;
  Gli_Obj_t *pFanin;
  Gli_Obj_t *pObj;
  word *pGateTruth_local;
  int nFanouts_local;
  Vec_Int_t *vFanins_local;
  Gli_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vFanins);
  if (iVar1 < 0x11) {
    iVar1 = Vec_IntSize(vFanins);
    pObj_00 = Gli_ObjAlloc(p,iVar1,nFanouts);
    local_3c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vFanins);
      bVar3 = false;
      if (local_3c < iVar1) {
        iVar1 = Vec_IntEntry(vFanins,local_3c);
        pGStack_38 = Gli_ManObj(p,iVar1);
        bVar3 = pGStack_38 != (Gli_Obj_t *)0x0;
      }
      if (!bVar3) break;
      Gli_ObjAddFanin(pObj_00,pGStack_38);
      local_3c = local_3c + 1;
    }
    pObj_00->pTruth = pGateTruth;
    uVar2 = Gli_NodeComputeValue(pObj_00);
    *(uint *)pObj_00 = *(uint *)pObj_00 & 0xfffffffb | (uVar2 & 1) << 2;
    *(uint *)pObj_00 = *(uint *)pObj_00 & 0xfffffffd | (uVar2 & 1) << 1;
    return pObj_00->Handle;
  }
  __assert_fail("Vec_IntSize(vFanins) <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                ,0x175,"int Gli_ManCreateNode(Gli_Man_t *, Vec_Int_t *, int, word *)");
}

Assistant:

int Gli_ManCreateNode( Gli_Man_t * p, Vec_Int_t * vFanins, int nFanouts, word * pGateTruth )
{
    Gli_Obj_t * pObj, * pFanin;
    int i;
    assert( Vec_IntSize(vFanins) <= 16 );
    pObj = Gli_ObjAlloc( p, Vec_IntSize(vFanins), nFanouts );
    Gli_ManForEachEntry( vFanins, p, pFanin, i )
        Gli_ObjAddFanin( pObj, pFanin );
    pObj->pTruth = pGateTruth;
    pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
    return pObj->Handle;
}